

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O0

void populateAigPointerUnitGF
               (Aig_Man_t *pAigNew,ltlNode *topASTNode,Vec_Ptr_t *vSignal,Vec_Vec_t *vAigGFMap)

{
  ltlNode_t *plVar1;
  ltlNode *pLtlNode;
  int local_3c;
  int serialNumSignal;
  ltlNode *nextToNextNode;
  ltlNode *nextNode;
  Vec_Vec_t *vAigGFMap_local;
  Vec_Ptr_t *vSignal_local;
  ltlNode *topASTNode_local;
  Aig_Man_t *pAigNew_local;
  
  switch(topASTNode->type) {
  case AND:
  case OR:
  case IMPLY:
    populateAigPointerUnitGF(pAigNew,topASTNode->left,vSignal,vAigGFMap);
    populateAigPointerUnitGF(pAigNew,topASTNode->right,vSignal,vAigGFMap);
    break;
  case NOT:
    populateAigPointerUnitGF(pAigNew,topASTNode->left,vSignal,vAigGFMap);
    break;
  case GLOBALLY:
    plVar1 = topASTNode->left;
    plVar1->type = EVENTUALLY;
    pLtlNode = plVar1->left;
    if (pLtlNode->type == BOOL) {
      if (pLtlNode->pObj == (Aig_Obj_t *)0x0) {
        __assert_fail("nextToNextNode->pObj",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x20e,
                      "void populateAigPointerUnitGF(Aig_Man_t *, ltlNode *, Vec_Ptr_t *, Vec_Vec_t *)"
                     );
      }
      local_3c = Vec_PtrFind(vSignal,pLtlNode->pObj);
      if (local_3c == -1) {
        Vec_PtrPush(vSignal,pLtlNode->pObj);
        local_3c = Vec_PtrFind(vSignal,pLtlNode->pObj);
      }
      Vec_VecPush(vAigGFMap,local_3c,topASTNode);
    }
    else {
      if (pLtlNode->pObj != (Aig_Obj_t *)0x0) {
        __assert_fail("nextToNextNode->pObj == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/live/ltl_parser.c"
                      ,0x21a,
                      "void populateAigPointerUnitGF(Aig_Man_t *, ltlNode *, Vec_Ptr_t *, Vec_Vec_t *)"
                     );
      }
      buildLogicFromLTLNode_combinationalOnly(pAigNew,pLtlNode);
      local_3c = Vec_PtrFind(vSignal,pLtlNode->pObj);
      if (local_3c == -1) {
        Vec_PtrPush(vSignal,pLtlNode->pObj);
        local_3c = Vec_PtrFind(vSignal,pLtlNode->pObj);
      }
      Vec_VecPush(vAigGFMap,local_3c,topASTNode);
    }
    break;
  default:
    printf("\nINVALID situation: aborting...\n");
    exit(0);
  case BOOL:
  }
  return;
}

Assistant:

void populateAigPointerUnitGF( Aig_Man_t *pAigNew, ltlNode *topASTNode, Vec_Ptr_t *vSignal, Vec_Vec_t *vAigGFMap )
{
	ltlNode *nextNode, *nextToNextNode;
	int serialNumSignal;

	switch( topASTNode->type ){
		case AND:
		case OR:
		case IMPLY:
			populateAigPointerUnitGF( pAigNew, topASTNode->left, vSignal, vAigGFMap );
			populateAigPointerUnitGF( pAigNew, topASTNode->right, vSignal, vAigGFMap );
			return;
		case NOT:
			populateAigPointerUnitGF( pAigNew, topASTNode->left, vSignal, vAigGFMap );
			return;
		case GLOBALLY:
			nextNode = topASTNode->left;
			assert( nextNode->type = EVENTUALLY );
			nextToNextNode = nextNode->left;
			if( nextToNextNode->type == BOOL )
			{
				assert( nextToNextNode->pObj );
				serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				if( serialNumSignal == -1 )
				{					
					Vec_PtrPush( vSignal, nextToNextNode->pObj );
					serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				}
				//Vec_PtrPush( vGLOBALLY, topASTNode );
				Vec_VecPush( vAigGFMap, serialNumSignal, topASTNode );
			}
			else
			{
				assert( nextToNextNode->pObj == NULL );
				buildLogicFromLTLNode_combinationalOnly( pAigNew, nextToNextNode );
				serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				if( serialNumSignal == -1 )
				{
					Vec_PtrPush( vSignal, nextToNextNode->pObj );
					serialNumSignal = Vec_PtrFind( vSignal, nextToNextNode->pObj );
				}
				//Vec_PtrPush( vGLOBALLY, topASTNode );
				Vec_VecPush( vAigGFMap, serialNumSignal, topASTNode );
			}
			return;
		case BOOL:
			return;
		default:
			printf("\nINVALID situation: aborting...\n");
			exit(0);
	}
}